

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

double trng::math::detail::GammaQ_asympt<double>(double a,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (x - a) / a;
  dVar1 = mln1p<double>(dVar3);
  dVar2 = dVar1 + dVar1;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = (double)((ulong)ABS(dVar2) | (ulong)dVar3 & 0x8000000000000000);
  dVar2 = a * 0.5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = erfc(dVar3 * dVar2);
  dVar1 = GammaPQ_asympt_R<double>(a,dVar3,dVar1);
  return dVar1 + dVar2 * 0.5;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(eta * sqrt(a / 2)) / 2};
        const T correction{GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }